

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O2

void ircode_patch_init(ircode_t *code,uint16_t index)

{
  code_r *pcVar1;
  size_t sVar2;
  uint32_t p1;
  uint32_t p1_00;
  inst_t *piVar3;
  inst_t *piVar4;
  inst_t *piVar5;
  inst_t *piVar6;
  code_r *pcVar7;
  inst_t **ppiVar8;
  size_t sVar9;
  undefined6 in_register_00000032;
  size_t sVar10;
  uint32_t i;
  ulong uVar11;
  
  p1 = ircode_register_push_temp(code);
  piVar3 = inst_new(LOADK,p1,(uint32_t)CONCAT62(in_register_00000032,index),0,NO_TAG,0,0.0,0);
  piVar4 = inst_new(LOAD,p1,0,p1,NO_TAG,0,0.0,0);
  p1_00 = ircode_register_push_temp(code);
  piVar5 = inst_new(MOVE,p1_00,0,0,NO_TAG,0,0.0,0);
  ircode_register_pop(code);
  piVar6 = inst_new(CALL,p1,p1,1,NO_TAG,0,0.0,0);
  ircode_register_pop(code);
  pcVar7 = (code_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
  pcVar7->m = 8;
  ppiVar8 = (inst_t **)malloc(0x40);
  pcVar7->p = ppiVar8;
  *ppiVar8 = piVar3;
  ppiVar8[1] = piVar4;
  ppiVar8[2] = piVar5;
  pcVar1 = code->list;
  pcVar7->n = 4;
  ppiVar8[3] = piVar6;
  sVar2 = pcVar1->n;
  sVar9 = 4;
  for (uVar11 = 0; ppiVar8 = pcVar1->p, (uint)sVar2 != uVar11; uVar11 = uVar11 + 1) {
    piVar3 = ppiVar8[uVar11];
    ppiVar8 = pcVar7->p;
    if (sVar9 == pcVar7->m) {
      sVar10 = sVar9 * 2;
      if (sVar9 == 0) {
        sVar10 = 8;
      }
      pcVar7->m = sVar10;
      ppiVar8 = (inst_t **)realloc(ppiVar8,sVar10 << 3);
      pcVar7->p = ppiVar8;
      sVar9 = pcVar7->n;
    }
    pcVar7->n = sVar9 + 1;
    ppiVar8[sVar9] = piVar3;
    sVar9 = sVar9 + 1;
  }
  free(ppiVar8);
  free(code->list);
  code->list = pcVar7;
  return;
}

Assistant:

void ircode_patch_init (ircode_t *code, uint16_t index) {
    // prepend call instructions to code
    // LOADK temp index
    // LOAD  temp 0 temp
    // MOVE  temp+1 0
    // CALL  temp temp 1

    // load constant
    uint32_t dest = ircode_register_push_temp(code);
	inst_t *inst1 = inst_new(LOADK, dest, index, 0, NO_TAG, 0, 0.0, 0);

    // load from lookup
	inst_t *inst2 = inst_new(LOAD, dest, 0, dest, NO_TAG, 0, 0.0, 0);

    // prepare parameter
    uint32_t dest2 = ircode_register_push_temp(code);
	inst_t *inst3 = inst_new(MOVE, dest2, 0, 0, NO_TAG, 0, 0.0, 0);
    ircode_register_pop(code);

    // execute call
	inst_t *inst4 = inst_new(CALL, dest, dest, 1, NO_TAG, 0, 0.0, 0);

    // pop temps used
    ircode_register_pop(code);

    // create new instruction list
    code_r        *list = mem_alloc(NULL, sizeof(code_r));
    marray_init(*list);

    // add newly create instructions
    marray_push(inst_t*, *list, inst1);
    marray_push(inst_t*, *list, inst2);
    marray_push(inst_t*, *list, inst3);
    marray_push(inst_t*, *list, inst4);

    // then copy original instructions
    code_r *orig_list = code->list;
    uint32_t count = ircode_count(code);
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = marray_get(*orig_list, i);
        marray_push(inst_t*, *list, inst);
    }

    // free dest list
    marray_destroy(*orig_list);
    mem_free(code->list);

    // replace dest list with the newly created list
    code->list = list;
}